

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::ByteSizeLong
          (CustomLayerParams_CustomLayerParamValue *this)

{
  uint32 uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar1 = this->_oneof_case_[0];
  sVar5 = 0;
  if ((int)uVar1 < 0x1e) {
    if (uVar1 == 10) {
      sVar5 = 9;
    }
    else if (uVar1 == 0x14) {
      lVar3 = *(long *)((this->value_).longvalue_ + 8);
      uVar4 = (uint)lVar3 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = lVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  else if (uVar1 == 0x1e) {
    if ((this->value_).intvalue_ < 0) {
      sVar5 = 0xc;
    }
    else {
      uVar4 = (this->value_).intvalue_ | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = (size_t)((iVar2 * 9 + 0x49U >> 6) + 2);
    }
  }
  else if (uVar1 == 0x28) {
    uVar6 = (this->value_).longvalue_ | 1;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar5 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 2;
  }
  else if (uVar1 == 0x32) {
    sVar5 = 3;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

inline CustomLayerParams_CustomLayerParamValue::ValueCase CustomLayerParams_CustomLayerParamValue::value_case() const {
  return CustomLayerParams_CustomLayerParamValue::ValueCase(_oneof_case_[0]);
}